

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::PromiseClient::writeTarget
          (PromiseClient *this,Builder target)

{
  long *plVar1;
  ClientHook *extraout_RDX;
  ClientHook *pCVar2;
  ClientHook *extraout_RDX_00;
  long in_RSI;
  RpcClient *result;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> MVar3;
  _func_int **local_28;
  void *pvStack_20;
  
  *(undefined1 *)(in_RSI + 0x68) = 1;
  plVar1 = *(long **)(in_RSI + 0x48);
  if ((plVar1[1] == *(long *)(*(long *)(in_RSI + 0x28) + 0xb00)) &&
     (plVar1[5] == *(long *)(in_RSI + 0x28))) {
    (**(code **)(*plVar1 + 0x50))(this);
    pCVar2 = extraout_RDX_00;
  }
  else {
    (**(code **)(*plVar1 + 0x20))(&local_28);
    (this->super_RpcClient).super_ClientHook._vptr_ClientHook = local_28;
    (this->super_RpcClient).super_ClientHook.brand = pvStack_20;
    pCVar2 = extraout_RDX;
  }
  MVar3.ptr.ptr = pCVar2;
  MVar3.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>)MVar3.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> writeTarget(
        rpc::MessageTarget::Builder target) override {
      receivedCall = true;
      return connectionState->writeTarget(*cap, target);
    }